

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugTextEncoding(char *str)

{
  bool bVar1;
  int iVar2;
  ImFont *this;
  ImFontGlyph *pIVar3;
  char *local_38;
  int local_2c;
  int byte_index;
  int c_utf8_len;
  uint c;
  char *p;
  char *local_10;
  char *str_local;
  
  local_10 = str;
  Text("Text: \"%s\"",str);
  ImVec2::ImVec2((ImVec2 *)&p,0.0,0.0);
  bVar1 = BeginTable("list",4,0x27c0,(ImVec2 *)&p,0.0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    TableSetupColumn("Offset",0,0.0,0);
    TableSetupColumn("UTF-8",0,0.0,0);
    TableSetupColumn("Glyph",0,0.0,0);
    TableSetupColumn("Codepoint",0,0.0,0);
    TableHeadersRow();
    for (_c_utf8_len = local_10; *_c_utf8_len != '\0'; _c_utf8_len = _c_utf8_len + iVar2) {
      iVar2 = ImTextCharFromUtf8((uint *)&byte_index,_c_utf8_len,(char *)0x0);
      TableNextColumn();
      Text("%d",(ulong)(uint)((int)_c_utf8_len - (int)local_10));
      TableNextColumn();
      for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
        if (0 < local_2c) {
          SameLine(0.0,-1.0);
        }
        Text("0x%02X",(ulong)(byte)_c_utf8_len[local_2c]);
      }
      TableNextColumn();
      this = GetFont();
      pIVar3 = ImFont::FindGlyphNoFallback(this,(ImWchar)byte_index);
      if (pIVar3 == (ImFontGlyph *)0x0) {
        if (byte_index == 0xfffd) {
          local_38 = "[invalid]";
        }
        else {
          local_38 = "[missing]";
        }
        TextUnformatted(local_38,(char *)0x0);
      }
      else {
        TextUnformatted(_c_utf8_len,_c_utf8_len + iVar2);
      }
      TableNextColumn();
      Text("U+%04X",(ulong)(uint)byte_index);
    }
    EndTable();
  }
  return;
}

Assistant:

void ImGui::DebugTextEncoding(const char* str)
{
    Text("Text: \"%s\"", str);
    if (!BeginTable("list", 4, ImGuiTableFlags_Borders | ImGuiTableFlags_RowBg | ImGuiTableFlags_SizingFixedFit))
        return;
    TableSetupColumn("Offset");
    TableSetupColumn("UTF-8");
    TableSetupColumn("Glyph");
    TableSetupColumn("Codepoint");
    TableHeadersRow();
    for (const char* p = str; *p != 0; )
    {
        unsigned int c;
        const int c_utf8_len = ImTextCharFromUtf8(&c, p, NULL);
        TableNextColumn();
        Text("%d", (int)(p - str));
        TableNextColumn();
        for (int byte_index = 0; byte_index < c_utf8_len; byte_index++)
        {
            if (byte_index > 0)
                SameLine();
            Text("0x%02X", (int)(unsigned char)p[byte_index]);
        }
        TableNextColumn();
        if (GetFont()->FindGlyphNoFallback((ImWchar)c))
            TextUnformatted(p, p + c_utf8_len);
        else
            TextUnformatted((c == IM_UNICODE_CODEPOINT_INVALID) ? "[invalid]" : "[missing]");
        TableNextColumn();
        Text("U+%04X", (int)c);
        p += c_utf8_len;
    }
    EndTable();
}